

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlmvn.cc
# Opt level: O3

bool __thiscall klogic::mlmvn_forward_base::step(mlmvn_forward_base *this)

{
  pointer pvVar1;
  size_t sVar2;
  const_iterator xbeg;
  bool bVar3;
  pointer pmVar4;
  cvector *pcVar5;
  int iVar6;
  complex<double> *pcVar7;
  ulong uVar8;
  ulong uVar9;
  pointer this_00;
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  
  iVar6 = this->layer;
  uVar8 = (ulong)iVar6;
  pvVar1 = (this->net->neurons).
           super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = ((long)(this->net->neurons).
                 super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  bVar3 = true;
  if (uVar8 <= uVar9 && uVar9 - uVar8 != 0) {
    if ((uVar9 - 1 == uVar8) && (this->use_out == true)) {
      pcVar7 = (this->out)._M_current;
    }
    else {
      pcVar7 = (this->to->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
    }
    this_00 = *(pointer *)
               &pvVar1[uVar8].super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>._M_impl;
    pmVar4 = *(pointer *)
              ((long)&pvVar1[uVar8].super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>.
                      _M_impl + 8);
    if (this_00 < pmVar4) {
      sVar2 = this->from_size;
      xbeg._M_current =
           (this->from->
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)._M_impl
           .super__Vector_impl_data._M_start;
      do {
        mvn::output(this_00,xbeg,xbeg._M_current + sVar2);
        *(undefined8 *)pcVar7->_M_value = extraout_XMM0_Qa;
        *(undefined8 *)(pcVar7->_M_value + 8) = in_XMM1_Qa;
        this_00 = this_00 + 1;
        pmVar4 = *(pointer *)
                  ((long)&pvVar1[uVar8].
                          super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>._M_impl + 8)
        ;
        pcVar7 = pcVar7 + 1;
      } while (this_00 < pmVar4);
      this_00 = *(pointer *)
                 &pvVar1[uVar8].super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>.
                  _M_impl;
      iVar6 = this->layer;
    }
    this->from_size = (long)pmVar4 - (long)this_00 >> 5;
    pcVar5 = &this->layer1;
    if ((iVar6 == 0) || (this->from != pcVar5)) {
      this->from = pcVar5;
      pcVar5 = &this->layer2;
    }
    else {
      this->from = &this->layer2;
    }
    this->to = pcVar5;
    iVar6 = iVar6 + 1;
    this->layer = iVar6;
    uVar8 = ((long)(this->net->neurons).
                   super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->net->neurons).
                   super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    bVar3 = uVar8 < (ulong)(long)iVar6 || uVar8 - (long)iVar6 == 0;
  }
  return bVar3;
}

Assistant:

bool klogic::mlmvn_forward_base::step()
{
    // Don't do anything if we've already passed all layers
    if (layer >= net.layers_count())
        return true;

    // Use *from as input to layer neurons
    cvector::const_iterator from_beg = from->begin();
    cvector::const_iterator from_end = from_beg + from_size;

    // use *to or out as output
    cvector::iterator j = (layer == net.layers_count() - 1 && use_out)
        ? out : to->begin();

    const vector<mvn> &layer_neurons = net.neurons[layer];

    for (vector<mvn>::const_iterator i = layer_neurons.begin(); i < layer_neurons.end(); ++i)
        *j++ = i->output(from_beg, from_end);

    // Set up "from" and "to" for the next layer
    from_size = layer_neurons.size();

    if (layer == 0) {
        // for the first layer output is always in layer1
        from = &layer1;
        to = &layer2;
    } else if (from == &layer1) {
        from = &layer2;
        to = &layer1;
    } else {
        from = &layer1;
        to = &layer2;
    }

    return ++layer >= net.layers_count();
}